

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void runExperiment(cpu_set_t *cpuset,int numOfThreads,int repeat,bool useTraditional)

{
  size_t __n;
  uint *__arg;
  pthread_t *__newthread;
  pthread_t pVar1;
  long *plVar2;
  __cpu_mask *p_Var3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  long *plVar7;
  ostream *poVar8;
  undefined7 in_register_00000009;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  code *__start_routine;
  long lVar13;
  undefined8 uStack_60;
  uint auStack_58 [2];
  cpu_set_t *local_50;
  ulong local_48;
  long local_40;
  int local_38;
  int local_34;
  
  local_38 = (int)CONCAT71(in_register_00000009,useTraditional);
  local_48 = (ulong)(uint)numOfThreads;
  local_40 = (long)auStack_58 - (local_48 * 8 + 0xf & 0xfffffffffffffff0);
  lVar13 = local_40 - (local_48 * 4 + 0xf & 0xfffffffffffffff0);
  uVar11 = 0xffffffffffffffff;
  if (0 < numOfThreads) {
    uVar11 = local_48 * 8;
  }
  local_50 = cpuset;
  local_34 = numOfThreads;
  *(undefined8 *)(lVar13 + -8) = 0x102bb7;
  plVar7 = (long *)operator_new__(uVar11);
  lVar12 = 0;
  *plVar7 = 0;
  __n = uVar11 - 8;
  *(undefined8 *)(lVar13 + -8) = 0x102bd2;
  memset(plVar7 + 1,0,__n);
  *(undefined8 *)(lVar13 + -8) = 0x102be1;
  throughputDelete = plVar7;
  plVar7 = (long *)operator_new__(uVar11);
  *plVar7 = 0;
  *(undefined8 *)(lVar13 + -8) = 0x102bf5;
  memset(plVar7 + 1,0,__n);
  *(undefined8 *)(lVar13 + -8) = 0x102c04;
  throughputInsert = plVar7;
  plVar7 = (long *)operator_new__(uVar11);
  *plVar7 = 0;
  *(undefined8 *)(lVar13 + -8) = 0x102c18;
  memset(plVar7 + 1,0,__n);
  __start_routine = RunCPQExperiment;
  if (local_38 != 0) {
    __start_routine = RunTraditionalPQExperiment;
  }
  lVar9 = 0;
  lVar10 = 0;
  throughputRandom = plVar7;
  if (0 < local_34) {
    uVar11 = 0;
    do {
      lVar12 = local_40;
      __arg = (uint *)(lVar13 + uVar11 * 4);
      *__arg = (uint)uVar11;
      __newthread = (pthread_t *)(lVar12 + uVar11 * 8);
      *(undefined8 *)(lVar13 + -8) = 0x102c68;
      iVar5 = pthread_create(__newthread,(pthread_attr_t *)0x0,__start_routine,__arg);
      pVar1 = *__newthread;
      p_Var3 = local_50->__bits;
      *(undefined8 *)(lVar13 + -8) = 0x102c84;
      iVar6 = pthread_setaffinity_np
                        (pVar1,0x80,(cpu_set_t *)((long)p_Var3 + (ulong)(((uint)uVar11 & 7) << 7)));
      uVar4 = local_48;
      if (iVar6 != 0) {
        *(undefined8 *)(lVar13 + -8) = 0x102dc2;
        printf("Thread %d affinities was not set",uVar11 & 0xffffffff);
        *(code **)(lVar13 + -8) = main;
        pthread_exit((void *)0x0);
      }
      if (iVar5 != 0) {
        *(undefined8 *)(lVar13 + -8) = 0x102d95;
        poVar8 = std::operator<<((ostream *)&std::cout,"Error: thread wasn\'t created,");
        *(undefined8 *)(lVar13 + -8) = 0x102d9f;
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar5);
        *(undefined8 *)(lVar13 + -8) = 0x102da7;
        std::endl<char,std::char_traits<char>>(poVar8);
        *(undefined8 *)(lVar13 + -8) = 0x102db1;
        exit(-1);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != local_48);
    if (local_34 < 1) {
      lVar12 = 0;
      lVar9 = 0;
      lVar10 = 0;
    }
    else {
      uVar11 = 0;
      lVar10 = 0;
      lVar9 = 0;
      lVar12 = 0;
      do {
        pVar1 = *(pthread_t *)(local_40 + uVar11 * 8);
        *(undefined8 *)(lVar13 + -8) = 0x102cc5;
        pthread_join(pVar1,(void **)0x0);
        lVar12 = lVar12 + throughputDelete[uVar11];
        lVar9 = lVar9 + throughputInsert[uVar11];
        lVar10 = lVar10 + throughputRandom[uVar11];
        uVar11 = uVar11 + 1;
      } while (uVar4 != uVar11);
      lVar9 = lVar9 / 5;
      lVar12 = lVar12 / 5;
      lVar10 = lVar10 / 5;
    }
  }
  plVar2 = throughputByThread[(long)local_34 + -1];
  uVar11 = (ulong)((uint)(byte)((byte)local_38 ^ 1) * 0x18);
  *(long *)((long)plVar2 + uVar11) = *(long *)((long)plVar2 + uVar11) + lVar9;
  plVar7 = (long *)((long)plVar2 + uVar11 + 8);
  *plVar7 = *plVar7 + lVar12;
  plVar2 = (long *)((long)plVar2 + uVar11 + 0x10);
  *plVar2 = *plVar2 + lVar10;
  return;
}

Assistant:

void runExperiment(const cpu_set_t *cpuset, int numOfThreads, int repeat, bool useTraditional) {
    pthread_t threads[numOfThreads];
    struct threadData td[numOfThreads];
    throughputDelete = new long[numOfThreads]{0};
    throughputInsert = new long[numOfThreads]{0};
    throughputRandom = new long[numOfThreads]{0};
    void *(*routine)(void *) = useTraditional ? RunTraditionalPQExperiment : RunCPQExperiment;

    for (int i = 0; i < numOfThreads; i++) {
        td[i].threadId = i;

        int rc = pthread_create(&threads[i], nullptr, routine, (void *) &td[i]);

        int s = pthread_setaffinity_np(threads[i], sizeof(cpu_set_t), &cpuset[i % CORES]);
        if (s != 0) {
            printf("Thread %d affinities was not set", i);
            pthread_exit(nullptr);
        }

        if (rc) {
            cout << "Error: thread wasn't created," << rc << endl;
            exit(-1);
        }
    }

    long throughputDeleteSum = 0;
    long throughputInsertSum = 0;
    long throughputRandomSum = 0;

    for (int i = 0; i < numOfThreads; i++) {
        pthread_join(threads[i], nullptr);

        throughputDeleteSum += throughputDelete[i];
        throughputInsertSum += throughputInsert[i];
        throughputRandomSum += throughputRandom[i];
    }

//    cout << "SUM " << (useTraditional ? "TRADITIONAL" : "RELAXED") << " THROUGHPUT PUSH: " << throughputInsertSum
//         << endl;
//    cout << "SUM " << (useTraditional ? "TRADITIONAL" : "RELAXED") << " THROUGHPUT POP: " << throughputDeleteSum
//         << endl;
//    cout << "SUM " << (useTraditional ? "TRADITIONAL" : "RELAXED") << " THROUGHPUT RANDOM: " << throughputRandomSum
//         << endl;

    int relaxedOffset = useTraditional ? 0 : 3;
    throughputByThread[numOfThreads - 1][relaxedOffset] += throughputInsertSum / REPEATS;
    throughputByThread[numOfThreads - 1][relaxedOffset + 1] += throughputDeleteSum / REPEATS;
    throughputByThread[numOfThreads - 1][relaxedOffset + 2] += throughputRandomSum / REPEATS;

//    delete throughputDelete;
//    delete throughputInsert;
//    delete throughputRandom;
}